

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::dropEvent(QGraphicsScene *this,QGraphicsSceneDragDropEvent *event)

{
  QGraphicsScenePrivate *this_00;
  
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  if (this_00->dragDropItem != (QGraphicsItem *)0x0) {
    QGraphicsScenePrivate::sendDragDropEvent(this_00,this_00->dragDropItem,event);
    this_00->dragDropItem = (QGraphicsItem *)0x0;
  }
  return;
}

Assistant:

void QGraphicsScene::dropEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_UNUSED(event);
    Q_D(QGraphicsScene);
    if (d->dragDropItem) {
        // Drop on the last drag drop item
        d->sendDragDropEvent(d->dragDropItem, event);
        d->dragDropItem = nullptr;
    }
}